

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::NanoVDBMediumProvider::Le(NanoVDBMediumProvider *this,Point3f *p,SampledWavelengths *lambda)

{
  Float a;
  array<float,_4> aVar1;
  float T;
  ValueT VVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  SampledSpectrum SVar9;
  Vec3<float> xyz;
  SampledSpectrum local_40;
  SampledSpectrum local_30;
  BlackbodySpectrum local_20;
  undefined1 auVar5 [56];
  undefined1 auVar8 [56];
  
  if (this->temperatureFloatGrid != (FloatGrid *)0x0) {
    local_30.values.values._0_12_ = p->super_Tuple3<pbrt::Point3,_float>;
    xyz = nanovdb::Map::applyInverseMapF<nanovdb::Vec3<float>>
                    (&(this->densityFloatGrid->super_GridData).mMap,(Vec3<float> *)&local_30);
    local_30.values.values._0_8_ = this->temperatureFloatGrid + 1;
    VVar2 = nanovdb::
            SampleFromVoxels<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>,_1,_false>
            ::operator()<float,_nanovdb::Vec3>
                      ((SampleFromVoxels<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>,_1,_false>
                        *)&local_30,xyz);
    T = (VVar2 - this->temperatureCutoff) * this->temperatureScale;
    auVar5 = (undefined1  [56])0x0;
    if (100.0 < T) {
      a = this->LeScale;
      auVar8 = (undefined1  [56])0x0;
      BlackbodySpectrum::BlackbodySpectrum(&local_20,T);
      SVar9 = BlackbodySpectrum::Sample(&local_20,lambda);
      auVar6._0_8_ = SVar9.values.values._8_8_;
      auVar6._8_56_ = auVar8;
      auVar3._0_8_ = SVar9.values.values._0_8_;
      auVar3._8_56_ = auVar5;
      local_30.values.values = (array<float,_4>)vmovlhps_avx(auVar3._0_16_,auVar6._0_16_);
      auVar5 = (undefined1  [56])0x0;
      SVar9 = SampledSpectrum::operator*(&local_30,a);
      auVar7._0_8_ = SVar9.values.values._8_8_;
      auVar7._8_56_ = auVar8;
      auVar4._0_8_ = SVar9.values.values._0_8_;
      auVar4._8_56_ = auVar5;
      aVar1.values = (float  [4])vmovlhps_avx(auVar4._0_16_,auVar7._0_16_);
      return (SampledSpectrum)(array<float,_4>)aVar1.values;
    }
  }
  SampledSpectrum::SampledSpectrum(&local_40,0.0);
  return (array<float,_4>)(array<float,_4>)local_40;
}

Assistant:

Le(const Point3f &p, const SampledWavelengths &lambda) const {
        if (!temperatureFloatGrid)
            return SampledSpectrum(0.f);
        nanovdb::Vec3<float> pIndex =
            densityFloatGrid->worldToIndexF(nanovdb::Vec3<float>(p.x, p.y, p.z));
        using Sampler = nanovdb::SampleFromVoxels<nanovdb::FloatGrid::TreeType, 1, false>;
        Float temp = Sampler(temperatureFloatGrid->tree())(pIndex);
        temp = (temp - temperatureCutoff) * temperatureScale;
        if (temp <= 100.f)
            return SampledSpectrum(0.f);
        return LeScale * BlackbodySpectrum(temp).Sample(lambda);
    }